

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_rational.hpp
# Opt level: O1

Rational * soplex::LPFreadInfinity(Rational *__return_storage_ptr__,char **pos)

{
  long lVar1;
  char cVar2;
  byte bVar3;
  long lVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  double *pdVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  char *pcVar13;
  char *pcVar14;
  data_type local_78;
  undefined4 local_68;
  undefined2 local_64;
  char local_62;
  ulong local_58;
  void *local_50;
  undefined4 local_48;
  undefined2 local_44;
  char local_42;
  
  local_78.la[0] = (ulong)(**pos != '-') * 2 - 1;
  iVar12 = 0;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>
            (&__return_storage_ptr__->m_backend,(longlong *)local_78.la,(type *)0x0);
  pcVar13 = *pos + 1;
  *pos = pcVar13;
  iVar10 = 0;
  do {
    lVar8 = (long)iVar12;
    cVar2 = "inf[inity]"[lVar8];
    if (cVar2 == '[') {
      pcVar5 = "inf[inity]" + (iVar12 + 1);
      lVar11 = 0;
      iVar6 = iVar12;
      do {
        iVar12 = iVar6;
        pcVar14 = pcVar5;
        cVar2 = pcVar13[lVar11 + iVar10];
        iVar7 = tolower((int)cVar2);
        lVar1 = lVar11 + 1;
        if (cVar2 == '\0') break;
        lVar4 = lVar11 + lVar8 + 1;
        pcVar5 = pcVar14 + 1;
        lVar11 = lVar1;
        iVar6 = iVar12 + 1;
      } while (iVar7 == "inf[inity]"[lVar4]);
      do {
        iVar12 = iVar12 + 1;
        cVar2 = *pcVar14;
        pcVar14 = pcVar14 + 1;
      } while (cVar2 != ']');
      iVar10 = iVar10 + (int)lVar1 + -2;
    }
    else {
      if (cVar2 == '\0') goto LAB_00177877;
      iVar6 = tolower((int)pcVar13[iVar10]);
      if (iVar6 != cVar2) {
        if (cVar2 == '\0') {
LAB_00177877:
          bVar3 = pcVar13[iVar10];
          if ((((ulong)bVar3 < 0x21) && ((0x100002601U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) ||
             ((byte)(bVar3 - 0x3c) < 3)) {
            *pos = pcVar13 + iVar10;
          }
        }
        ::soplex::infinity::__tls_init();
        pdVar9 = (double *)__tls_get_addr(&PTR_003b6b60);
        local_78.la[0] = 0;
        local_68 = 1;
        local_64 = 0x100;
        local_62 = '\0';
        local_58 = 1;
        local_48 = 1;
        local_44 = 0x100;
        local_42 = '\0';
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
        ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                     *)&local_78.ld,(longdouble)*pdVar9);
        boost::
        rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator*=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)__return_storage_ptr__,
                     (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)&local_78.ld);
        if ((local_44._1_1_ == '\0') && (local_42 == '\0')) {
          operator_delete(local_50,(local_58 & 0xffffffff) << 3);
        }
        if ((local_64._1_1_ == '\0') && (local_62 == '\0')) {
          operator_delete(local_78.ld.data,(local_78.la[0] & 0xffffffff) << 3);
        }
        return __return_storage_ptr__;
      }
    }
    iVar12 = iVar12 + 1;
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

static Rational LPFreadInfinity(char*& pos)
{
   assert(LPFisInfinity(pos));

   Rational sense = (*pos == '-') ? -1 : 1;

   (void) LPFhasKeyword(++pos, "inf[inity]");

   sense *= Rational(infinity);
   return sense;
}